

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O2

void QTable::Load(string *filename,size_t nrRows,size_t nrColumns,size_t nrTables,QTables *Qs)

{
  pointer pQVar1;
  ostream *poVar2;
  istream *piVar3;
  E *pEVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  double q;
  string buffer;
  QTable Q;
  ifstream fp;
  byte abStack_398 [488];
  istringstream is;
  
  std::ifstream::ifstream(&fp,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_398[*(long *)(_fp + -0x18)] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"QTable::Load: failed to ");
    poVar2 = std::operator<<(poVar2,"open file ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  QTable(&Q,nrRows,nrColumns);
  std::vector<QTable,_std::allocator<QTable>_>::clear(Qs);
  sVar6 = nrTables;
  while (bVar8 = sVar6 != 0, sVar6 = sVar6 - 1, bVar8) {
    std::vector<QTable,_std::allocator<QTable>_>::push_back(Qs,&Q);
  }
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  sVar7 = 0;
  sVar6 = 0;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&fp,(string *)&buffer);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 2) != 0) {
      if (sVar6 == nrTables) {
        std::__cxx11::string::~string((string *)&buffer);
        boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                  (&Q.super_matrix_t.data_);
        std::ifstream::~ifstream(&fp);
        return;
      }
      pEVar4 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar4,"QTable::Load wrong number of tables");
      __cxa_throw(pEVar4,&E::typeinfo,E::~E);
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
    sVar5 = 0;
    while( true ) {
      piVar3 = std::istream::_M_extract<double>((double *)&is);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      pQVar1 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pQVar1[sVar6].super_matrix_t.data_.data_[pQVar1[sVar6].super_matrix_t.size2_ * sVar7 + sVar5]
           = q;
      sVar5 = sVar5 + 1;
    }
    if (nrColumns != sVar5) break;
    sVar7 = sVar7 + 1;
    bVar8 = sVar7 == nrRows;
    if (bVar8) {
      sVar7 = 0;
    }
    sVar6 = sVar6 + bVar8;
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  }
  pEVar4 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar4,"QTable::Load wrong number of columns");
  __cxa_throw(pEVar4,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Load(const std::string &filename,
                  size_t nrRows,
                  size_t nrColumns,
                  size_t nrTables,
                  QTables &Qs)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "QTable::Load: failed to "
             << "open file " << filename << endl;            
    }

    size_t a,s,i;
    double q;

    QTable Q(nrRows,nrColumns);
//    QTables Qs;
    Qs.clear();
    for(i=0;i!=nrTables;i++)
        Qs.push_back(Q);
    
    s=0;
    i=0;
    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        a=0;
        while(is >> q)
            Qs[i](s,a++)=q;

        if(a!=nrColumns)
            throw(E("QTable::Load wrong number of columns"));

        s++;
        if(s==nrRows)
        {
            i++;
            s=0;
        }
    }
    
    if(i!=nrTables)
        throw(E("QTable::Load wrong number of tables"));
}